

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

double __thiscall doctest::detail::MessageBuilder::log(MessageBuilder *this,double __x)

{
  bool bVar1;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *this_00;
  reference ppIVar2;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double dVar3;
  bool isWarn;
  IReporter **curr_rep;
  iterator __end2;
  iterator __begin2;
  vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *__range2;
  String local_28;
  MessageBuilder *local_10;
  MessageBuilder *this_local;
  
  local_10 = this;
  if ((this->logged & 1U) == 0) {
    tlssPop();
    String::operator=((String *)this,&local_28);
    String::~String(&local_28);
    this->logged = true;
  }
  this_00 = (vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_> *)(g_cs + 0x10d0);
  __end2 = std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::begin(this_00);
  curr_rep = (IReporter **)
             std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>::end(this_00);
  while (bVar1 = __gnu_cxx::
                 operator==<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                           (&__end2,(__normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
                                     *)&curr_rep), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppIVar2 = __gnu_cxx::
              __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
              ::operator*(&__end2);
    (*(*ppIVar2)->_vptr_IReporter[10])(*ppIVar2,this);
    __gnu_cxx::
    __normal_iterator<doctest::IReporter_**,_std::vector<doctest::IReporter_*,_std::allocator<doctest::IReporter_*>_>_>
    ::operator++(&__end2);
  }
  if (((this->super_MessageData).m_severity & is_warn) == 0) {
    anon_unknown_14::addAssert((this->super_MessageData).m_severity);
    anon_unknown_14::addFailedAssert((this->super_MessageData).m_severity);
  }
  bVar1 = isDebuggerActive();
  dVar3 = extraout_XMM0_Qa;
  if (bVar1) {
    getContextOptions();
    dVar3 = extraout_XMM0_Qa_00;
  }
  return dVar3;
}

Assistant:

bool MessageBuilder::log() {
        if (!logged) {
            m_string = tlssPop();
            logged = true;
        }
        
        DOCTEST_ITERATE_THROUGH_REPORTERS(log_message, *this);

        const bool isWarn = m_severity & assertType::is_warn;

        // warn is just a message in this context so we don't treat it as an assert
        if(!isWarn) {
            addAssert(m_severity);
            addFailedAssert(m_severity);
        }

        return isDebuggerActive() && !getContextOptions()->no_breaks && !isWarn &&
            (g_cs->currentTest == nullptr || !g_cs->currentTest->m_no_breaks); // break into debugger
    }